

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O1

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::~BGIP_SolverBranchAndBound
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this)

{
  priority_queue<boost::shared_ptr<BGIP_BnB_Node>,_std::vector<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>,_std::less<boost::shared_ptr<BGIP_BnB_Node>_>_>
  *this_00;
  pointer puVar1;
  pointer pdVar2;
  
  *(undefined ***)
   &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
    super_BGIP_IncrementalSolverInterface = &PTR_InitDeadline_00117c68;
  this_00 = this->_m_openQueue;
  if (this_00 !=
      (priority_queue<boost::shared_ptr<BGIP_BnB_Node>,_std::vector<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>,_std::less<boost::shared_ptr<BGIP_BnB_Node>_>_>
       *)0x0) {
    std::
    vector<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>::
    ~vector(&this_00->c);
    operator_delete(this_00,0x20);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&this->_m_jaToIndCache);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&this->_m_depthFirstSpecified);
  puVar1 = (this->_m_jtIndexMapping).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->_m_jtIndexMapping).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  pdVar2 = (this->_m_completeInformationValues).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2,(long)(this->_m_completeInformationValues).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
  }
  boost::detail::shared_count::~shared_count(&(this->_m_bestNode).pn);
  boost::detail::shared_count::~shared_count(&(this->_m_bgip).pn);
  *(code **)&(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
             super_BGIP_IncrementalSolverInterface = __cxa_rethrow;
  BGIPSolution::~BGIPSolution
            ((BGIPSolution *)
             &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
              super_BGIP_IncrementalSolverInterface.field_0x18);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
              super_BGIP_IncrementalSolverInterface.field_0x10);
  return;
}

Assistant:

double Solve()
    {
        _m_solved=true;
        this->InitDeadline();
        if(_m_verbosity>=1)
            std::cout << "BGIP_SolverBranchAndBound::Solve() called."<<std::endl;
        // Compute upper bound heuristic values
        ComputeCompleteInformationValues();
        
        // Reorder the joint types
        ReOrderJointTypes(_m_jtIndexMapping); 

        if(_m_verbosity>=1)
            std::cout
                << "BGIP_SolverBranchAndBound Resulting order of joint types: "
                << SoftPrintVector(_m_jtIndexMapping) << std::endl;

        // Initialize root node
        BGIP_BnB_NodePtr root;
        // If we want to update the joint type index mapping during the
        // search, we have to maintain it for each node. Otherwise we can
        // just use the copy in this class.
#if DYNAMIC_JT_INDEX_MAPPING
        if(_m_reComputeJTIndexMapping)
            root = new BGIP_BnB_Node(_m_bgip, _m_maxDepth,
                                     _m_jtIndexMapping);
        else
#endif
            root = BGIP_BnB_NodePtr(new BGIP_BnB_Node(_m_bgip->GetNrAgents()));
        // G is initialized to 0,
        // H is also initialized to 0, so we now *add* the contributions for each joint type
        for(Index jt_bgI=0;jt_bgI!=_m_bgip->GetNrJointTypes();++jt_bgI)
            root->UpdateH(_m_completeInformationValues.at(jt_bgI));

        // push the root node on the queue of open nodes
        _m_openQueue->push(root);

        if(_m_verbosity>3)
            std::cout << "BGIP_SolverBranchAndBound "
                      << root->SoftPrint() << std::endl;

        return(ReSolve());
    }